

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaCompareFloats(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  double local_30;
  double d2;
  double d1;
  xmlSchemaValPtr y_local;
  xmlSchemaValPtr x_local;
  
  if ((x == (xmlSchemaValPtr)0x0) || (y == (xmlSchemaValPtr)0x0)) {
    x_local._4_4_ = -2;
  }
  else {
    if (x->type == XML_SCHEMAS_DOUBLE) {
      d2 = (x->value).d;
    }
    else {
      if (x->type != XML_SCHEMAS_FLOAT) {
        return -2;
      }
      d2 = (double)(x->value).f;
    }
    if (y->type == XML_SCHEMAS_DOUBLE) {
      local_30 = (y->value).d;
    }
    else {
      if (y->type != XML_SCHEMAS_FLOAT) {
        return -2;
      }
      local_30 = (double)(y->value).f;
    }
    if (NAN(d2)) {
      if (NAN(local_30)) {
        x_local._4_4_ = 0;
      }
      else {
        x_local._4_4_ = 1;
      }
    }
    else if (NAN(local_30)) {
      x_local._4_4_ = -1;
    }
    else if (local_30 <= d2) {
      if (d2 <= local_30) {
        if ((d2 != local_30) || (NAN(d2) || NAN(local_30))) {
          x_local._4_4_ = 2;
        }
        else {
          x_local._4_4_ = 0;
        }
      }
      else {
        x_local._4_4_ = 1;
      }
    }
    else {
      x_local._4_4_ = -1;
    }
  }
  return x_local._4_4_;
}

Assistant:

static int
xmlSchemaCompareFloats(xmlSchemaValPtr x, xmlSchemaValPtr y) {
    double d1, d2;

    if ((x == NULL) || (y == NULL))
	return(-2);

    /*
     * Cast everything to doubles.
     */
    if (x->type == XML_SCHEMAS_DOUBLE)
	d1 = x->value.d;
    else if (x->type == XML_SCHEMAS_FLOAT)
	d1 = x->value.f;
    else
	return(-2);

    if (y->type == XML_SCHEMAS_DOUBLE)
	d2 = y->value.d;
    else if (y->type == XML_SCHEMAS_FLOAT)
	d2 = y->value.f;
    else
	return(-2);

    /*
     * Check for special cases.
     */
    if (isnan(d1)) {
	if (isnan(d2))
	    return(0);
	return(1);
    }
    if (isnan(d2))
	return(-1);

    /*
     * basic tests, the last one we should have equality, but
     * portability is more important than speed and handling
     * NaN or Inf in a portable way is always a challenge, so ...
     */
    if (d1 < d2)
	return(-1);
    if (d1 > d2)
	return(1);
    if (d1 == d2)
	return(0);
    return(2);
}